

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonKey
               (ostream *stream,string *element_name,string *name,int value,string *indent,
               bool comma)

{
  bool bVar1;
  ostream *poVar2;
  string local_b0;
  GTestLog local_8c;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *allowed_names;
  string *psStack_30;
  bool comma_local;
  string *indent_local;
  string *psStack_20;
  int value_local;
  string *name_local;
  string *element_name_local;
  ostream *stream_local;
  
  allowed_names._7_1_ = comma;
  psStack_30 = indent;
  indent_local._4_4_ = value;
  psStack_20 = name;
  name_local = element_name;
  element_name_local = (string *)stream;
  GetReservedOutputAttributesForElement(&local_58,element_name);
  local_40 = &local_58;
  local_68._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&local_58);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(local_40);
  local_60 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_68,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_70,psStack_20);
  local_88[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(local_40);
  bVar1 = __gnu_cxx::operator!=(&local_60,local_88);
  bVar1 = IsTrue(bVar1);
  if (!bVar1) {
    GTestLog::GTestLog(&local_8c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/build_O0/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0x1037);
    poVar2 = GTestLog::GetStream(&local_8c);
    poVar2 = std::operator<<(poVar2,
                             "Condition std::find(allowed_names.begin(), allowed_names.end(), name) != allowed_names.end() failed. "
                            );
    poVar2 = std::operator<<(poVar2,"Key \"");
    poVar2 = std::operator<<(poVar2,(string *)psStack_20);
    poVar2 = std::operator<<(poVar2,"\" is not allowed for value \"");
    poVar2 = std::operator<<(poVar2,(string *)name_local);
    std::operator<<(poVar2,"\".");
    GTestLog::~GTestLog(&local_8c);
  }
  poVar2 = std::operator<<((ostream *)element_name_local,(string *)psStack_30);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2,(string *)psStack_20);
  poVar2 = std::operator<<(poVar2,"\": ");
  StreamableToString<int>(&local_b0,(int *)((long)&indent_local + 4));
  std::operator<<(poVar2,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if ((allowed_names._7_1_ & 1) != 0) {
    std::operator<<((ostream *)element_name_local,",\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonKey(
    std::ostream* stream,
    const std::string& element_name,
    const std::string& name,
    int value,
    const std::string& indent,
    bool comma) {
  const std::vector<std::string>& allowed_names =
      GetReservedOutputAttributesForElement(element_name);

  GTEST_CHECK_(std::find(allowed_names.begin(), allowed_names.end(), name) !=
                   allowed_names.end())
      << "Key \"" << name << "\" is not allowed for value \"" << element_name
      << "\".";

  *stream << indent << "\"" << name << "\": " << StreamableToString(value);
  if (comma)
    *stream << ",\n";
}